

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  ImRect IVar4;
  
  switch(rect_type) {
  case 0:
    IVar4 = ImGuiWindow::Rect(window);
    break;
  case 1:
    IVar4 = window->OuterRectClipped;
    break;
  case 2:
    IVar4 = window->InnerRect;
    break;
  case 3:
    IVar4 = window->InnerClipRect;
    break;
  case 4:
    IVar4 = window->WorkRect;
    break;
  case 5:
    IVar1 = (window->InnerRect).Min;
    fVar2 = (IVar1.x - (window->Scroll).x) + (window->WindowPadding).x;
    fVar3 = (IVar1.y - (window->Scroll).y) + (window->WindowPadding).y;
    IVar4.Min.y = fVar3;
    IVar4.Min.x = fVar2;
    IVar4.Max.y = (window->ContentSize).y + fVar3;
    IVar4.Max.x = (window->ContentSize).x + fVar2;
    break;
  case 6:
    IVar4 = window->ContentsRegionRect;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0x259a,
                  "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetWindowRect(ImGuiWindow *, int)"
                 );
  }
  return IVar4;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Contents)             { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentsRegionRect)   { return window->ContentsRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }